

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbytarr.cpp
# Opt level: O0

ssize_t __thiscall
CVmByteArraySource::write(CVmByteArraySource *this,int __fd,void *__buf,size_t __n)

{
  void *pvVar1;
  undefined4 in_register_00000034;
  size_t copied;
  size_t wrtlen;
  uchar *local_38;
  unsigned_long in_stack_ffffffffffffffd8;
  
  local_38 = (uchar *)__buf;
  if (this->end_idx < this->idx + (long)__buf) {
    local_38 = (uchar *)(this->end_idx - this->idx);
  }
  pvVar1 = (void *)CVmObjByteArray::copy_from_buf_undo
                             ((CVmObjByteArray *)CONCAT44(in_register_00000034,__fd),
                              (vm_obj_id_t)((ulong)__buf >> 0x20),local_38,in_stack_ffffffffffffffd8
                              ,(size_t)this);
  this->idx = (long)pvVar1 + this->idx;
  return (ulong)(pvVar1 != __buf);
}

Assistant:

virtual int write(const void *buf, size_t len)
    {
        /* establish global access */
        VMGLOB_PTR(vmg);
        
        /* limit the write to the available length */
        size_t wrtlen = (idx + (long)len > end_idx
                         ? (size_t)(end_idx - idx) : len);

        /* copy the requested bytes (saving undo) */
        size_t copied = arr->copy_from_buf_undo(
            vmg_ arr_id, (const unsigned char *)buf, idx + 1, wrtlen);

        /* move past the bytes copied */
        idx += copied;

        /* we were successful if we copied exactly the requested length */
        return copied != len;
    }